

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O3

void * prepend_alloc(mstate m,char *newbase,char *oldbase,size_t nb)

{
  mchunkptr pmVar1;
  long *plVar2;
  malloc_tree_chunk *pmVar3;
  malloc_tree_chunk *pmVar4;
  tbinptr pmVar5;
  tbinptr pmVar6;
  long lVar7;
  malloc_tree_chunk **ppmVar8;
  byte bVar9;
  uint uVar10;
  malloc_chunk *pmVar11;
  ulong uVar12;
  malloc_tree_chunk **ppmVar13;
  uint uVar14;
  ulong uVar15;
  malloc_chunk *pmVar16;
  tbinptr pmVar17;
  tbinptr pmVar18;
  long lVar19;
  ulong uVar20;
  
  uVar20 = (ulong)(-(int)newbase - 0x10U & 0xf);
  pmVar17 = (tbinptr)(oldbase + (-(int)oldbase - 0x10U & 0xf));
  pmVar1 = (mchunkptr)(newbase + nb + uVar20);
  uVar12 = (long)pmVar17 - (long)pmVar1;
  *(size_t *)(newbase + uVar20 + 8) = nb | 3;
  if (pmVar17 == (tbinptr)m->top) {
    uVar12 = uVar12 + m->topsize;
    m->topsize = uVar12;
    m->top = pmVar1;
    pmVar1->head = uVar12 | 1;
    goto LAB_001042e7;
  }
  if (pmVar17 == (tbinptr)m->dv) {
    uVar12 = uVar12 + m->dvsize;
    m->dvsize = uVar12;
    m->dv = pmVar1;
    pmVar1->head = uVar12 | 1;
    *(ulong *)((long)pmVar1 + uVar12) = uVar12;
    goto LAB_001042e7;
  }
  uVar15 = pmVar17->head;
  pmVar18 = pmVar17;
  if (((uint)uVar15 & 3) == 1) {
    if (uVar15 < 0x100) {
      pmVar3 = pmVar17->fd;
      pmVar4 = pmVar17->bk;
      if ((pmVar3 != (malloc_tree_chunk *)(m->smallbins + (uVar15 >> 3) * 2)) &&
         ((pmVar3 < (malloc_tree_chunk *)m->least_addr || (pmVar3->bk != pmVar17))))
      goto LAB_001042fb;
      if (pmVar4 == pmVar3) {
        bVar9 = (byte)(uVar15 >> 3) & 0x1f;
        m->smallmap = m->smallmap & (-2 << bVar9 | 0xfffffffeU >> 0x20 - bVar9);
      }
      else {
        if ((pmVar4 != (malloc_tree_chunk *)(m->smallbins + (uVar15 >> 3) * 2)) &&
           ((pmVar4 < (malloc_tree_chunk *)m->least_addr || (pmVar4->fd != pmVar17))))
        goto LAB_001042fb;
        pmVar3->bk = pmVar4;
        pmVar4->fd = pmVar3;
      }
    }
    else {
      pmVar18 = pmVar17->bk;
      pmVar3 = pmVar17->child[2];
      if (pmVar18 == pmVar17) {
        if (pmVar17->child[1] == (tbinptr)0x0) {
          if (pmVar17->child[0] == (tbinptr)0x0) {
            pmVar18 = (tbinptr)0x0;
            goto LAB_001040be;
          }
          pmVar5 = pmVar17->child[0];
          ppmVar8 = pmVar17->child;
        }
        else {
          pmVar5 = pmVar17->child[1];
          ppmVar8 = pmVar17->child + 1;
        }
        do {
          do {
            ppmVar13 = ppmVar8;
            pmVar18 = pmVar5;
            pmVar5 = pmVar18->child[1];
            ppmVar8 = pmVar18->child + 1;
          } while (pmVar18->child[1] != (malloc_tree_chunk *)0x0);
          pmVar5 = pmVar18->child[0];
          ppmVar8 = pmVar18->child;
        } while (pmVar18->child[0] != (malloc_tree_chunk *)0x0);
        if (ppmVar13 < m->least_addr) goto LAB_001042fb;
        *ppmVar13 = (malloc_tree_chunk *)0x0;
      }
      else {
        pmVar4 = pmVar17->fd;
        if (((pmVar4 < (malloc_tree_chunk *)m->least_addr) || (pmVar4->bk != pmVar17)) ||
           (pmVar18->fd != pmVar17)) goto LAB_001042fb;
        pmVar4->bk = pmVar18;
        pmVar18->fd = pmVar4;
      }
LAB_001040be:
      if (pmVar3 != (malloc_tree_chunk *)0x0) {
        uVar14 = *(uint *)(pmVar17->child + 3);
        if (pmVar17 == m->treebins[uVar14]) {
          m->treebins[uVar14] = pmVar18;
          if (pmVar18 == (tbinptr)0x0) {
            bVar9 = (byte)uVar14 & 0x1f;
            m->treemap = m->treemap & (-2 << bVar9 | 0xfffffffeU >> 0x20 - bVar9);
          }
          else {
LAB_00104101:
            pmVar5 = (tbinptr)m->least_addr;
            if (pmVar18 < pmVar5) goto LAB_001042fb;
            pmVar18->child[2] = pmVar3;
            pmVar6 = pmVar17->child[0];
            if (pmVar6 != (tbinptr)0x0) {
              if (pmVar6 < pmVar5) goto LAB_001042fb;
              pmVar18->child[0] = pmVar6;
              pmVar6->child[2] = pmVar18;
            }
            pmVar3 = pmVar17->child[1];
            if (pmVar3 != (malloc_tree_chunk *)0x0) {
              if (pmVar3 < (malloc_tree_chunk *)m->least_addr) goto LAB_001042fb;
              pmVar18->child[1] = pmVar3;
              pmVar3->parent = pmVar18;
            }
          }
        }
        else {
          if (pmVar3 < (malloc_tree_chunk *)m->least_addr) goto LAB_001042fb;
          pmVar3->child[pmVar3->child[0] != pmVar17] = pmVar18;
          if (pmVar18 != (tbinptr)0x0) goto LAB_00104101;
        }
      }
    }
    uVar15 = uVar15 & 0xfffffffffffffff8;
    pmVar18 = (tbinptr)((long)pmVar17->child + (uVar15 - 0x20));
    uVar12 = uVar12 + uVar15;
    uVar15 = *(ulong *)((long)pmVar17->child + (uVar15 - 0x18));
  }
  pmVar18->head = uVar15 & 0xfffffffffffffffe;
  pmVar1->head = uVar12 | 1;
  *(ulong *)((long)&pmVar1->prev_foot + uVar12) = uVar12;
  if (uVar12 < 0x100) {
    uVar12 = uVar12 >> 3;
    if ((m->smallmap >> ((uint)uVar12 & 0x1f) & 1) == 0) {
      m->smallmap = m->smallmap | 1 << ((byte)uVar12 & 0x1f);
      pmVar11 = (malloc_chunk *)(m->smallbins + uVar12 * 2);
    }
    else {
      pmVar11 = m->smallbins[uVar12 * 2 + 2];
      if (m->smallbins[uVar12 * 2 + 2] < (malloc_chunk *)m->least_addr) {
LAB_001042fb:
        abort();
      }
    }
    m->smallbins[uVar12 * 2 + 2] = pmVar1;
    pmVar11->bk = pmVar1;
    pmVar1->fd = pmVar11;
    pmVar1->bk = (malloc_chunk *)(m->smallbins + uVar12 * 2);
  }
  else {
    uVar14 = (uint)(uVar12 >> 8);
    if (uVar14 == 0) {
      uVar10 = 0;
    }
    else {
      uVar10 = 0x1f;
      if (uVar14 < 0x10000) {
        uVar10 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> uVar10 == 0; uVar10 = uVar10 - 1) {
          }
        }
        uVar10 = (uint)((uVar12 >> ((ulong)(byte)(0x26 - (char)(uVar10 ^ 0x1f)) & 0x3f) & 1) != 0) +
                 (uVar10 ^ 0x1f) * 2 ^ 0x3e;
      }
    }
    pmVar11 = (malloc_chunk *)(m->treebins + uVar10);
    *(uint *)&pmVar1[1].bk = uVar10;
    pmVar1[1].prev_foot = 0;
    pmVar1[1].head = 0;
    if ((m->treemap >> (uVar10 & 0x1f) & 1) == 0) {
      m->treemap = m->treemap | 1 << ((byte)uVar10 & 0x1f);
      pmVar11->prev_foot = (size_t)pmVar1;
      pmVar1[1].fd = pmVar11;
    }
    else {
      bVar9 = 0x39 - (char)(uVar10 >> 1);
      if (uVar10 == 0x1f) {
        bVar9 = 0;
      }
      lVar19 = uVar12 << (bVar9 & 0x3f);
      pmVar11 = (malloc_chunk *)pmVar11->prev_foot;
      do {
        pmVar16 = pmVar11;
        if ((pmVar16->head & 0xfffffffffffffff8) == uVar12) {
          if ((pmVar16 < (malloc_chunk *)m->least_addr) ||
             (pmVar11 = pmVar16->fd, pmVar11 < (malloc_chunk *)m->least_addr)) goto LAB_001042fb;
          pmVar11->bk = pmVar1;
          pmVar16->fd = pmVar1;
          pmVar1->fd = pmVar11;
          pmVar1->bk = pmVar16;
          pmVar1[1].fd = (malloc_chunk *)0x0;
          goto LAB_001042e7;
        }
        lVar7 = lVar19 >> 0x3f;
        lVar19 = lVar19 * 2;
        pmVar11 = *(malloc_chunk **)((long)pmVar16 + lVar7 * -8 + 0x20);
      } while (pmVar11 != (malloc_chunk *)0x0);
      plVar2 = (long *)((long)pmVar16 + lVar7 * -8 + 0x20);
      if (plVar2 < m->least_addr) goto LAB_001042fb;
      *plVar2 = (long)pmVar1;
      pmVar1[1].fd = pmVar16;
    }
    pmVar1->bk = pmVar1;
    pmVar1->fd = pmVar1;
  }
LAB_001042e7:
  return newbase + uVar20 + 0x10;
}

Assistant:

static void* prepend_alloc(mstate m, char* newbase, char* oldbase,
                           size_t nb) {
  mchunkptr p = align_as_chunk(newbase);
  mchunkptr oldfirst = align_as_chunk(oldbase);
  size_t psize = (char*)oldfirst - (char*)p;
  mchunkptr q = chunk_plus_offset(p, nb);
  size_t qsize = psize - nb;
  set_size_and_pinuse_of_inuse_chunk(m, p, nb);

  assert((char*)oldfirst > (char*)q);
  assert(pinuse(oldfirst));
  assert(qsize >= MIN_CHUNK_SIZE);

  /* consolidate remainder with first chunk of old base */
  if (oldfirst == m->top) {
    size_t tsize = m->topsize += qsize;
    m->top = q;
    q->head = tsize | PINUSE_BIT;
    check_top_chunk(m, q);
  }
  else if (oldfirst == m->dv) {
    size_t dsize = m->dvsize += qsize;
    m->dv = q;
    set_size_and_pinuse_of_free_chunk(q, dsize);
  }
  else {
    if (!is_inuse(oldfirst)) {
      size_t nsize = chunksize(oldfirst);
      unlink_chunk(m, oldfirst, nsize);
      oldfirst = chunk_plus_offset(oldfirst, nsize);
      qsize += nsize;
    }
    set_free_with_pinuse(q, qsize, oldfirst);
    insert_chunk(m, q, qsize);
    check_free_chunk(m, q);
  }

  check_malloced_chunk(m, chunk2mem(p), nb);
  return chunk2mem(p);
}